

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

BaseType spirv_cross::to_signed_basetype(uint32_t width)

{
  uint uVar1;
  CompilerError *this;
  uint uVar2;
  
  uVar1 = width - 8 >> 3;
  uVar2 = width << 0x1d | uVar1;
  if ((uVar2 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(BaseType *)(&DAT_00386580 + (ulong)uVar2 * 4);
  }
  this = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this,"Invalid bit width.");
  __cxa_throw(this,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline SPIRType::BaseType to_signed_basetype(uint32_t width)
{
	switch (width)
	{
	case 8:
		return SPIRType::SByte;
	case 16:
		return SPIRType::Short;
	case 32:
		return SPIRType::Int;
	case 64:
		return SPIRType::Int64;
	default:
		SPIRV_CROSS_THROW("Invalid bit width.");
	}
}